

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_257,_true,_embree::sse2::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  undefined4 uVar25;
  ulong unaff_R15;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  vfloat4 a0;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar72;
  float fVar73;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar74 [12];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  vfloat4 a;
  undefined1 auVar87 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar96;
  float fVar97;
  float fVar99;
  undefined1 auVar94 [16];
  float fVar98;
  float fVar100;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar105;
  float fVar107;
  float fVar109;
  undefined1 auVar103 [16];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar104 [16];
  uint uVar111;
  uint uVar112;
  float fVar113;
  uint uVar114;
  float fVar115;
  uint uVar116;
  float fVar117;
  float fVar118;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10c8 [8];
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  ulong local_1070;
  Intersectors *local_1068;
  RayQueryContext *local_1060;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1060 = context;
  local_1068 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    local_fd8 = aVar2.x;
    local_fe8 = aVar2.y;
    local_fc8 = aVar2.z;
    aVar72 = aVar2.field_3;
    fVar30 = local_fe8 * local_fe8;
    fVar31 = local_fc8 * local_fc8;
    fVar32 = aVar72.w * aVar72.w;
    fVar48 = fVar30 + local_fd8 * local_fd8 + fVar31;
    auVar55._0_8_ = CONCAT44(fVar30 + fVar30 + fVar32,fVar48);
    auVar55._8_4_ = fVar30 + fVar31 + fVar31;
    auVar55._12_4_ = fVar30 + fVar32 + fVar32;
    auVar44._8_4_ = auVar55._8_4_;
    auVar44._0_8_ = auVar55._0_8_;
    auVar44._12_4_ = auVar55._12_4_;
    auVar55 = rsqrtss(auVar44,auVar55);
    fVar30 = auVar55._0_4_;
    local_fb8[0] = fVar30 * 1.5 - fVar30 * fVar30 * fVar48 * 0.5 * fVar30;
    fVar30 = local_fd8 * local_fb8[0];
    fVar31 = local_fe8 * local_fb8[0];
    fVar32 = local_fc8 * local_fb8[0];
    fVar80 = -fVar31;
    fVar48 = -fVar32;
    auVar74._8_4_ = 0xffffffff;
    auVar74._0_8_ = 0xffffffffffffffff;
    if (fVar80 * fVar80 + fVar32 * fVar32 + 0.0 <= fVar30 * fVar30 + fVar48 * fVar48 + 0.0) {
      auVar74 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar67 = (float)((uint)fVar32 & auVar74._4_4_);
    fVar48 = (float)(~auVar74._0_4_ & (uint)fVar48);
    fVar70 = (float)(~auVar74._8_4_ & (uint)fVar30 | (uint)fVar80 & auVar74._8_4_);
    fVar80 = fVar67 * fVar67;
    fVar69 = fVar70 * fVar70;
    fVar81 = fVar80 + fVar48 * fVar48 + fVar69;
    auVar76._0_8_ = CONCAT44(fVar80 + fVar80 + 0.0,fVar81);
    auVar76._8_4_ = fVar80 + fVar69 + fVar69;
    auVar76._12_4_ = fVar80 + 0.0 + 0.0;
    auVar87._8_4_ = auVar76._8_4_;
    auVar87._0_8_ = auVar76._0_8_;
    auVar87._12_4_ = auVar76._12_4_;
    auVar55 = rsqrtss(auVar87,auVar76);
    fVar80 = auVar55._0_4_;
    fVar80 = fVar80 * 1.5 - fVar80 * fVar80 * fVar81 * 0.5 * fVar80;
    fVar48 = fVar80 * fVar48;
    fVar67 = fVar80 * fVar67;
    fVar70 = fVar80 * fVar70;
    fVar69 = fVar67 * fVar30 - fVar31 * fVar48;
    fVar81 = fVar70 * fVar31 - fVar32 * fVar67;
    fVar77 = fVar48 * fVar32 - fVar30 * fVar70;
    fVar79 = fVar80 * 0.0 * aVar72.w * local_fb8[0] - aVar72.w * local_fb8[0] * fVar80 * 0.0;
    fVar80 = fVar81 * fVar81;
    fVar78 = fVar77 * fVar77;
    fVar79 = fVar79 * fVar79;
    fVar91 = fVar78 + fVar80 + fVar69 * fVar69;
    fVar92 = fVar79 + fVar80 + fVar80;
    fVar78 = fVar78 + fVar80 + fVar78;
    fVar79 = fVar79 + fVar80 + fVar79;
    auVar66._4_4_ = fVar92;
    auVar66._0_4_ = fVar91;
    auVar66._8_4_ = fVar78;
    auVar66._12_4_ = fVar79;
    auVar50._4_4_ = fVar92;
    auVar50._0_4_ = fVar91;
    auVar50._8_4_ = fVar78;
    auVar50._12_4_ = fVar79;
    auVar55 = rsqrtss(auVar66,auVar50);
    fVar80 = auVar55._0_4_;
    fVar80 = fVar80 * 1.5 - fVar80 * fVar80 * fVar91 * 0.5 * fVar80;
    local_f88._4_4_ = fVar80 * fVar69;
    local_f88._0_4_ = fVar70;
    local_f88._8_4_ = local_fb8[0] * fVar32;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar80 * fVar77;
    local_f98._0_4_ = fVar67;
    local_f98._8_4_ = local_fb8[0] * fVar31;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar80 * fVar81;
    local_fa8._0_4_ = fVar48;
    local_fa8._8_4_ = local_fb8[0] * fVar30;
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar24 = (undefined1 (*) [16])local_f68;
      local_1038 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_ff8 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar30 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1008 = 0.0;
      if (0.0 <= fVar30) {
        local_1008 = fVar30;
      }
      fVar30 = (ray->super_RayK<1>).tfar;
      fVar31 = 0.0;
      if (0.0 <= fVar30) {
        fVar31 = fVar30;
      }
      auVar55 = divps(_DAT_01feca10,(undefined1  [16])aVar2);
      local_1098 = (float)(~-(uint)(1e-18 <= ABS(local_fd8)) & 0x5d5e0b6b |
                          auVar55._0_4_ & -(uint)(1e-18 <= ABS(local_fd8)));
      local_10b8 = (float)(~-(uint)(1e-18 <= ABS(local_fe8)) & 0x5d5e0b6b |
                          auVar55._4_4_ & -(uint)(1e-18 <= ABS(local_fe8)));
      local_1018 = (float)(~-(uint)(1e-18 <= ABS(local_fc8)) & 0x5d5e0b6b |
                          auVar55._8_4_ & -(uint)(1e-18 <= ABS(local_fc8)));
      local_1058 = local_1098 * 0.99999964;
      local_1088 = local_10b8 * 0.99999964;
      local_1028 = local_1018 * 0.99999964;
      local_1098 = local_1098 * 1.0000004;
      local_10b8 = local_10b8 * 1.0000004;
      local_1018 = local_1018 * 1.0000004;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      uVar23 = (ulong)(local_1058 < 0.0) * 0x10;
      uVar19 = (ulong)(local_1088 < 0.0) << 4 | 0x20;
      uVar21 = (ulong)(local_1028 < 0.0) << 4 | 0x40;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1084 = local_1088;
      fStack_1080 = local_1088;
      fStack_107c = local_1088;
      fStack_1094 = local_1098;
      fStack_1090 = local_1098;
      fStack_108c = local_1098;
      fStack_10b4 = local_10b8;
      fStack_10b0 = local_10b8;
      fStack_10ac = local_10b8;
      local_1070 = uVar21;
      uVar22 = uVar21;
      fVar30 = fVar31;
      fVar32 = fVar31;
      fVar48 = fVar31;
      fVar80 = local_1008;
      fVar67 = local_1008;
      fVar69 = local_1008;
      fVar70 = local_1008;
      fVar81 = local_1058;
      fVar77 = local_1058;
      fVar78 = local_1058;
      fVar79 = local_1058;
      fVar91 = local_1038;
      fVar92 = local_1038;
      fVar117 = local_1038;
      fVar118 = local_1038;
      fVar98 = local_1048;
      fVar100 = local_1048;
      fVar102 = local_1048;
      fVar106 = local_1048;
      fVar108 = local_ff8;
      fVar110 = local_ff8;
      fVar113 = local_ff8;
      fVar115 = local_ff8;
      fVar63 = local_10b8;
      fVar68 = local_10b8;
      fVar71 = local_10b8;
      fVar73 = local_10b8;
      fVar82 = local_1088;
      fVar83 = local_1088;
      fVar84 = local_1088;
      fVar85 = local_1088;
      fVar86 = local_1098;
      fVar88 = local_1098;
      fVar89 = local_1098;
      fVar90 = local_1098;
      fVar93 = local_1018;
      fVar96 = local_1018;
      fVar97 = local_1018;
      fVar99 = local_1018;
      fVar101 = local_1028;
      fVar105 = local_1028;
      fVar107 = local_1028;
      fVar109 = local_1028;
      do {
        do {
          if (pauVar24 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar15 = pauVar24 + -1;
          pauVar24 = pauVar24 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar15 + 8));
        uVar18 = *(ulong *)*pauVar24;
        do {
          if ((uVar18 & 0xf) == 0) {
            pfVar1 = (float *)(uVar18 + 0x20 + uVar23);
            auVar33._0_4_ = (*pfVar1 - fVar91) * fVar81;
            auVar33._4_4_ = (pfVar1[1] - fVar92) * fVar77;
            auVar33._8_4_ = (pfVar1[2] - fVar117) * fVar78;
            auVar33._12_4_ = (pfVar1[3] - fVar118) * fVar79;
            pfVar1 = (float *)(uVar18 + 0x20 + uVar19);
            auVar42._0_4_ = (*pfVar1 - fVar98) * fVar82;
            auVar42._4_4_ = (pfVar1[1] - fVar100) * fVar83;
            auVar42._8_4_ = (pfVar1[2] - fVar102) * fVar84;
            auVar42._12_4_ = (pfVar1[3] - fVar106) * fVar85;
            auVar55 = maxps(auVar33,auVar42);
            pfVar1 = (float *)(uVar18 + 0x20 + uVar22);
            auVar43._0_4_ = (*pfVar1 - fVar108) * fVar101;
            auVar43._4_4_ = (pfVar1[1] - fVar110) * fVar105;
            auVar43._8_4_ = (pfVar1[2] - fVar113) * fVar107;
            auVar43._12_4_ = (pfVar1[3] - fVar115) * fVar109;
            pfVar1 = (float *)(uVar18 + 0x20 + (uVar23 ^ 0x10));
            auVar49._0_4_ = (*pfVar1 - fVar91) * fVar86;
            auVar49._4_4_ = (pfVar1[1] - fVar92) * fVar88;
            auVar49._8_4_ = (pfVar1[2] - fVar117) * fVar89;
            auVar49._12_4_ = (pfVar1[3] - fVar118) * fVar90;
            pfVar1 = (float *)(uVar18 + 0x20 + (uVar19 ^ 0x10));
            auVar56._0_4_ = (*pfVar1 - fVar98) * fVar63;
            auVar56._4_4_ = (pfVar1[1] - fVar100) * fVar68;
            auVar56._8_4_ = (pfVar1[2] - fVar102) * fVar71;
            auVar56._12_4_ = (pfVar1[3] - fVar106) * fVar73;
            auVar50 = minps(auVar49,auVar56);
            pfVar1 = (float *)(uVar18 + 0x20 + (uVar21 ^ 0x10));
            auVar57._0_4_ = (*pfVar1 - fVar108) * fVar93;
            auVar57._4_4_ = (pfVar1[1] - fVar110) * fVar96;
            auVar57._8_4_ = (pfVar1[2] - fVar113) * fVar97;
            auVar57._12_4_ = (pfVar1[3] - fVar115) * fVar99;
            auVar8._4_4_ = fVar67;
            auVar8._0_4_ = fVar80;
            auVar8._8_4_ = fVar69;
            auVar8._12_4_ = fVar70;
            auVar44 = maxps(auVar43,auVar8);
            _local_10c8 = maxps(auVar55,auVar44);
            auVar7._4_4_ = fVar30;
            auVar7._0_4_ = fVar31;
            auVar7._8_4_ = fVar32;
            auVar7._12_4_ = fVar48;
            auVar55 = minps(auVar57,auVar7);
            auVar55 = minps(auVar50,auVar55);
            auVar34._4_4_ = -(uint)(local_10c8._4_4_ <= auVar55._4_4_);
            auVar34._0_4_ = -(uint)(local_10c8._0_4_ <= auVar55._0_4_);
            auVar34._8_4_ = -(uint)(local_10c8._8_4_ <= auVar55._8_4_);
            auVar34._12_4_ = -(uint)(local_10c8._12_4_ <= auVar55._12_4_);
            uVar25 = movmskps((int)unaff_R15,auVar34);
LAB_00de60bf:
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar25);
            bVar14 = true;
          }
          else {
            if ((int)(uVar18 & 0xf) == 2) {
              uVar17 = uVar18 & 0xfffffffffffffff0;
              fVar91 = local_fd8 * *(float *)(uVar17 + 0x20) +
                       local_fe8 * *(float *)(uVar17 + 0x50) + local_fc8 * *(float *)(uVar17 + 0x80)
              ;
              fVar92 = fStack_fd4 * *(float *)(uVar17 + 0x24) +
                       fStack_fe4 * *(float *)(uVar17 + 0x54) +
                       fStack_fc4 * *(float *)(uVar17 + 0x84);
              fVar117 = fStack_fd0 * *(float *)(uVar17 + 0x28) +
                        fStack_fe0 * *(float *)(uVar17 + 0x58) +
                        fStack_fc0 * *(float *)(uVar17 + 0x88);
              fVar118 = fStack_fcc * *(float *)(uVar17 + 0x2c) +
                        fStack_fdc * *(float *)(uVar17 + 0x5c) +
                        fStack_fbc * *(float *)(uVar17 + 0x8c);
              fVar80 = local_fd8 * *(float *)(uVar17 + 0x30) +
                       local_fe8 * *(float *)(uVar17 + 0x60) + local_fc8 * *(float *)(uVar17 + 0x90)
              ;
              fVar67 = fStack_fd4 * *(float *)(uVar17 + 0x34) +
                       fStack_fe4 * *(float *)(uVar17 + 100) +
                       fStack_fc4 * *(float *)(uVar17 + 0x94);
              fVar69 = fStack_fd0 * *(float *)(uVar17 + 0x38) +
                       fStack_fe0 * *(float *)(uVar17 + 0x68) +
                       fStack_fc0 * *(float *)(uVar17 + 0x98);
              fVar70 = fStack_fcc * *(float *)(uVar17 + 0x3c) +
                       fStack_fdc * *(float *)(uVar17 + 0x6c) +
                       fStack_fbc * *(float *)(uVar17 + 0x9c);
              fVar81 = local_fd8 * *(float *)(uVar17 + 0x40) +
                       local_fe8 * *(float *)(uVar17 + 0x70) + local_fc8 * *(float *)(uVar17 + 0xa0)
              ;
              fVar77 = fStack_fd4 * *(float *)(uVar17 + 0x44) +
                       fStack_fe4 * *(float *)(uVar17 + 0x74) +
                       fStack_fc4 * *(float *)(uVar17 + 0xa4);
              fVar78 = fStack_fd0 * *(float *)(uVar17 + 0x48) +
                       fStack_fe0 * *(float *)(uVar17 + 0x78) +
                       fStack_fc0 * *(float *)(uVar17 + 0xa8);
              fVar79 = fStack_fcc * *(float *)(uVar17 + 0x4c) +
                       fStack_fdc * *(float *)(uVar17 + 0x7c) +
                       fStack_fbc * *(float *)(uVar17 + 0xac);
              uVar111 = (uint)DAT_01fec6c0;
              uVar112 = DAT_01fec6c0._4_4_;
              uVar114 = DAT_01fec6c0._8_4_;
              uVar116 = DAT_01fec6c0._12_4_;
              uVar26 = -(uint)(1e-18 <= (float)((uint)fVar91 & uVar111));
              uVar27 = -(uint)(1e-18 <= (float)((uint)fVar92 & uVar112));
              uVar28 = -(uint)(1e-18 <= (float)((uint)fVar117 & uVar114));
              uVar29 = -(uint)(1e-18 <= (float)((uint)fVar118 & uVar116));
              auVar94._0_8_ = CONCAT44(~uVar27,~uVar26) & 0x219392ef219392ef;
              auVar94._8_4_ = ~uVar28 & 0x219392ef;
              auVar94._12_4_ = ~uVar29 & 0x219392ef;
              auVar12._4_4_ = (uint)fVar92 & uVar27;
              auVar12._0_4_ = (uint)fVar91 & uVar26;
              auVar12._8_4_ = (uint)fVar117 & uVar28;
              auVar12._12_4_ = (uint)fVar118 & uVar29;
              auVar94 = auVar94 | auVar12;
              uVar26 = -(uint)(1e-18 <= (float)((uint)fVar80 & uVar111));
              uVar27 = -(uint)(1e-18 <= (float)((uint)fVar67 & uVar112));
              uVar28 = -(uint)(1e-18 <= (float)((uint)fVar69 & uVar114));
              uVar29 = -(uint)(1e-18 <= (float)((uint)fVar70 & uVar116));
              auVar35._0_4_ = (uint)fVar80 & uVar26;
              auVar35._4_4_ = (uint)fVar67 & uVar27;
              auVar35._8_4_ = (uint)fVar69 & uVar28;
              auVar35._12_4_ = (uint)fVar70 & uVar29;
              auVar103._0_8_ = CONCAT44(~uVar27,~uVar26) & 0x219392ef219392ef;
              auVar103._8_4_ = ~uVar28 & 0x219392ef;
              auVar103._12_4_ = ~uVar29 & 0x219392ef;
              auVar103 = auVar103 | auVar35;
              uVar26 = -(uint)(1e-18 <= (float)((uint)fVar81 & uVar111));
              uVar27 = -(uint)(1e-18 <= (float)((uint)fVar77 & uVar112));
              uVar28 = -(uint)(1e-18 <= (float)((uint)fVar78 & uVar114));
              uVar29 = -(uint)(1e-18 <= (float)((uint)fVar79 & uVar116));
              auVar36._0_8_ = CONCAT44(~uVar27,~uVar26) & 0x219392ef219392ef;
              auVar36._8_4_ = ~uVar28 & 0x219392ef;
              auVar36._12_4_ = ~uVar29 & 0x219392ef;
              auVar9._4_4_ = (uint)fVar77 & uVar27;
              auVar9._0_4_ = (uint)fVar81 & uVar26;
              auVar9._8_4_ = (uint)fVar78 & uVar28;
              auVar9._12_4_ = (uint)fVar79 & uVar29;
              auVar36 = auVar36 | auVar9;
              auVar55 = rcpps(_DAT_01fec6c0,auVar94);
              fVar78 = auVar55._0_4_;
              fVar79 = auVar55._4_4_;
              fVar91 = auVar55._8_4_;
              fVar92 = auVar55._12_4_;
              fVar78 = (1.0 - auVar94._0_4_ * fVar78) * fVar78 + fVar78;
              fVar79 = (1.0 - auVar94._4_4_ * fVar79) * fVar79 + fVar79;
              fVar91 = (1.0 - auVar94._8_4_ * fVar91) * fVar91 + fVar91;
              fVar92 = (1.0 - auVar94._12_4_ * fVar92) * fVar92 + fVar92;
              auVar55 = rcpps(auVar55,auVar103);
              fVar117 = auVar55._0_4_;
              fVar118 = auVar55._4_4_;
              fVar98 = auVar55._8_4_;
              fVar100 = auVar55._12_4_;
              fVar117 = (1.0 - auVar103._0_4_ * fVar117) * fVar117 + fVar117;
              fVar118 = (1.0 - auVar103._4_4_ * fVar118) * fVar118 + fVar118;
              fVar98 = (1.0 - auVar103._8_4_ * fVar98) * fVar98 + fVar98;
              fVar100 = (1.0 - auVar103._12_4_ * fVar100) * fVar100 + fVar100;
              auVar55 = rcpps(auVar55,auVar36);
              fVar102 = auVar55._0_4_;
              fVar106 = auVar55._4_4_;
              fVar108 = auVar55._8_4_;
              fVar110 = auVar55._12_4_;
              fVar102 = (1.0 - auVar36._0_4_ * fVar102) * fVar102 + fVar102;
              fVar106 = (1.0 - auVar36._4_4_ * fVar106) * fVar106 + fVar106;
              fVar108 = (1.0 - auVar36._8_4_ * fVar108) * fVar108 + fVar108;
              fVar110 = (1.0 - auVar36._12_4_ * fVar110) * fVar110 + fVar110;
              auVar13._4_4_ = fStack_1004;
              auVar13._0_4_ = local_1008;
              auVar13._8_4_ = fStack_1000;
              auVar13._12_4_ = fStack_ffc;
              local_10a8 = *(float *)(uVar17 + 0x70) * local_1048 +
                           *(float *)(uVar17 + 0xa0) * local_ff8 + *(float *)(uVar17 + 0xd0);
              fStack_10a4 = *(float *)(uVar17 + 0x74) * fStack_1044 +
                            *(float *)(uVar17 + 0xa4) * fStack_ff4 + *(float *)(uVar17 + 0xd4);
              fStack_10a0 = *(float *)(uVar17 + 0x78) * fStack_1040 +
                            *(float *)(uVar17 + 0xa8) * fStack_ff0 + *(float *)(uVar17 + 0xd8);
              fStack_109c = *(float *)(uVar17 + 0x7c) * fStack_103c +
                            *(float *)(uVar17 + 0xac) * fStack_fec + *(float *)(uVar17 + 0xdc);
              uVar26 = (uint)DAT_01fec6d0;
              uVar27 = DAT_01fec6d0._4_4_;
              uVar28 = DAT_01fec6d0._8_4_;
              uVar29 = DAT_01fec6d0._12_4_;
              fVar81 = (*(float *)(uVar17 + 0x20) * local_1038 +
                       *(float *)(uVar17 + 0x50) * local_1048 +
                       *(float *)(uVar17 + 0x80) * local_ff8 + *(float *)(uVar17 + 0xb0)) *
                       (float)((uint)fVar78 ^ uVar26);
              fVar77 = (*(float *)(uVar17 + 0x24) * fStack_1034 +
                       *(float *)(uVar17 + 0x54) * fStack_1044 +
                       *(float *)(uVar17 + 0x84) * fStack_ff4 + *(float *)(uVar17 + 0xb4)) *
                       (float)((uint)fVar79 ^ uVar27);
              auVar64._0_8_ = CONCAT44(fVar77,fVar81);
              auVar64._8_4_ =
                   (*(float *)(uVar17 + 0x28) * fStack_1030 +
                   *(float *)(uVar17 + 0x58) * fStack_1040 +
                   *(float *)(uVar17 + 0x88) * fStack_ff0 + *(float *)(uVar17 + 0xb8)) *
                   (float)((uint)fVar91 ^ uVar28);
              auVar64._12_4_ =
                   (*(float *)(uVar17 + 0x2c) * fStack_102c +
                   *(float *)(uVar17 + 0x5c) * fStack_103c +
                   *(float *)(uVar17 + 0x8c) * fStack_fec + *(float *)(uVar17 + 0xbc)) *
                   (float)((uint)fVar92 ^ uVar29);
              fVar80 = (*(float *)(uVar17 + 0x30) * local_1038 +
                       *(float *)(uVar17 + 0x60) * local_1048 +
                       *(float *)(uVar17 + 0x90) * local_ff8 + *(float *)(uVar17 + 0xc0)) *
                       (float)((uint)fVar117 ^ uVar26);
              fVar67 = (*(float *)(uVar17 + 0x34) * fStack_1034 +
                       *(float *)(uVar17 + 100) * fStack_1044 +
                       *(float *)(uVar17 + 0x94) * fStack_ff4 + *(float *)(uVar17 + 0xc4)) *
                       (float)((uint)fVar118 ^ uVar27);
              auVar45._0_8_ = CONCAT44(fVar67,fVar80);
              auVar45._8_4_ =
                   (*(float *)(uVar17 + 0x38) * fStack_1030 +
                   *(float *)(uVar17 + 0x68) * fStack_1040 +
                   *(float *)(uVar17 + 0x98) * fStack_ff0 + *(float *)(uVar17 + 200)) *
                   (float)((uint)fVar98 ^ uVar28);
              auVar45._12_4_ =
                   (*(float *)(uVar17 + 0x3c) * fStack_102c +
                   *(float *)(uVar17 + 0x6c) * fStack_103c +
                   *(float *)(uVar17 + 0x9c) * fStack_fec + *(float *)(uVar17 + 0xcc)) *
                   (float)((uint)fVar100 ^ uVar29);
              fVar69 = (*(float *)(uVar17 + 0x40) * local_1038 + local_10a8) *
                       (float)((uint)fVar102 ^ uVar26);
              fVar70 = (*(float *)(uVar17 + 0x44) * fStack_1034 + fStack_10a4) *
                       (float)((uint)fVar106 ^ uVar27);
              auVar51._0_8_ = CONCAT44(fVar70,fVar69);
              auVar51._8_4_ =
                   (*(float *)(uVar17 + 0x48) * fStack_1030 + fStack_10a0) *
                   (float)((uint)fVar108 ^ uVar28);
              auVar51._12_4_ =
                   (*(float *)(uVar17 + 0x4c) * fStack_102c + fStack_109c) *
                   (float)((uint)fVar110 ^ uVar29);
              fVar78 = fVar78 + fVar81;
              fVar79 = fVar79 + fVar77;
              fVar91 = fVar91 + auVar64._8_4_;
              fVar92 = fVar92 + auVar64._12_4_;
              auVar95._0_4_ = fVar117 + fVar80;
              auVar95._4_4_ = fVar118 + fVar67;
              auVar95._8_4_ = fVar98 + auVar45._8_4_;
              auVar95._12_4_ = fVar100 + auVar45._12_4_;
              auVar104._0_4_ = fVar102 + fVar69;
              auVar104._4_4_ = fVar106 + fVar70;
              auVar104._8_4_ = fVar108 + auVar51._8_4_;
              auVar104._12_4_ = fVar110 + auVar51._12_4_;
              auVar37._8_4_ = auVar45._8_4_;
              auVar37._0_8_ = auVar45._0_8_;
              auVar37._12_4_ = auVar45._12_4_;
              auVar55 = minps(auVar37,auVar95);
              auVar58._8_4_ = auVar51._8_4_;
              auVar58._0_8_ = auVar51._0_8_;
              auVar58._12_4_ = auVar51._12_4_;
              auVar44 = minps(auVar58,auVar104);
              auVar55 = maxps(auVar55,auVar44);
              auVar59._8_4_ = auVar64._8_4_;
              auVar59._0_8_ = auVar64._0_8_;
              auVar59._12_4_ = auVar64._12_4_;
              auVar10._4_4_ = fVar79;
              auVar10._0_4_ = fVar78;
              auVar10._8_4_ = fVar91;
              auVar10._12_4_ = fVar92;
              auVar66 = minps(auVar59,auVar10);
              auVar11._4_4_ = fVar79;
              auVar11._0_4_ = fVar78;
              auVar11._8_4_ = fVar91;
              auVar11._12_4_ = fVar92;
              auVar76 = maxps(auVar64,auVar11);
              auVar44 = maxps(auVar45,auVar95);
              auVar50 = maxps(auVar51,auVar104);
              auVar44 = minps(auVar44,auVar50);
              auVar50 = maxps(auVar13,auVar66);
              auVar50 = maxps(auVar50,auVar55);
              auVar38._4_4_ = fVar30;
              auVar38._0_4_ = fVar31;
              auVar38._8_4_ = fVar32;
              auVar38._12_4_ = fVar48;
              auVar55 = minps(auVar38,auVar76);
              auVar55 = minps(auVar55,auVar44);
              local_10c8._0_4_ = auVar50._0_4_ * 0.99999964;
              local_10c8._4_4_ = auVar50._4_4_ * 0.99999964;
              fStack_10c0 = auVar50._8_4_ * 0.99999964;
              fStack_10bc = auVar50._12_4_ * 0.99999964;
              auVar52._4_4_ = -(uint)((float)local_10c8._4_4_ <= auVar55._4_4_ * 1.0000004);
              auVar52._0_4_ = -(uint)((float)local_10c8._0_4_ <= auVar55._0_4_ * 1.0000004);
              auVar52._8_4_ = -(uint)(fStack_10c0 <= auVar55._8_4_ * 1.0000004);
              auVar52._12_4_ = -(uint)(fStack_10bc <= auVar55._12_4_ * 1.0000004);
              uVar25 = movmskps((int)unaff_R15,auVar52);
              fVar80 = local_1008;
              fVar67 = fStack_1004;
              fVar69 = fStack_1000;
              fVar70 = fStack_ffc;
              fVar81 = local_1058;
              fVar77 = fStack_1054;
              fVar78 = fStack_1050;
              fVar79 = fStack_104c;
              fVar91 = local_1038;
              fVar92 = fStack_1034;
              fVar117 = fStack_1030;
              fVar118 = fStack_102c;
              fVar98 = local_1048;
              fVar100 = fStack_1044;
              fVar102 = fStack_1040;
              fVar106 = fStack_103c;
              fVar108 = local_ff8;
              fVar110 = fStack_ff4;
              fVar113 = fStack_ff0;
              fVar115 = fStack_fec;
              fVar63 = local_10b8;
              fVar68 = fStack_10b4;
              fVar71 = fStack_10b0;
              fVar73 = fStack_10ac;
              fVar82 = local_1088;
              fVar83 = fStack_1084;
              fVar84 = fStack_1080;
              fVar85 = fStack_107c;
              fVar86 = local_1098;
              fVar88 = fStack_1094;
              fVar89 = fStack_1090;
              fVar90 = fStack_108c;
              fVar93 = local_1018;
              fVar96 = fStack_1014;
              fVar97 = fStack_1010;
              fVar99 = fStack_100c;
              fVar101 = local_1028;
              fVar105 = fStack_1024;
              fVar107 = fStack_1020;
              fVar109 = fStack_101c;
              goto LAB_00de60bf;
            }
            bVar14 = false;
          }
          if (bVar14) {
            if (unaff_R15 == 0) {
              iVar16 = 4;
            }
            else {
              uVar17 = uVar18 & 0xfffffffffffffff0;
              lVar6 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              iVar16 = 0;
              uVar18 = *(ulong *)(uVar17 + lVar6 * 8);
              uVar20 = unaff_R15 - 1 & unaff_R15;
              if (uVar20 != 0) {
                uVar26 = *(uint *)(local_10c8 + lVar6 * 4);
                lVar6 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar5 = *(ulong *)(uVar17 + lVar6 * 8);
                uVar27 = *(uint *)(local_10c8 + lVar6 * 4);
                uVar20 = uVar20 - 1 & uVar20;
                if (uVar20 == 0) {
                  if (uVar26 < uVar27) {
                    *(ulong *)*pauVar24 = uVar5;
                    *(uint *)((long)*pauVar24 + 8) = uVar27;
                    pauVar24 = pauVar24 + 1;
                  }
                  else {
                    *(ulong *)*pauVar24 = uVar18;
                    *(uint *)((long)*pauVar24 + 8) = uVar26;
                    uVar18 = uVar5;
                    pauVar24 = pauVar24 + 1;
                  }
                }
                else {
                  auVar39._8_4_ = uVar26;
                  auVar39._0_8_ = uVar18;
                  auVar39._12_4_ = 0;
                  auVar46._8_4_ = uVar27;
                  auVar46._0_8_ = uVar5;
                  auVar46._12_4_ = 0;
                  lVar6 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                    }
                  }
                  uVar18 = *(ulong *)(uVar17 + lVar6 * 8);
                  iVar3 = *(int *)(local_10c8 + lVar6 * 4);
                  auVar53._8_4_ = iVar3;
                  auVar53._0_8_ = uVar18;
                  auVar53._12_4_ = 0;
                  auVar60._8_4_ = -(uint)((int)uVar26 < (int)uVar27);
                  uVar20 = uVar20 - 1 & uVar20;
                  if (uVar20 == 0) {
                    auVar60._4_4_ = auVar60._8_4_;
                    auVar60._0_4_ = auVar60._8_4_;
                    auVar60._12_4_ = auVar60._8_4_;
                    auVar55 = auVar39 & auVar60 | ~auVar60 & auVar46;
                    auVar44 = auVar46 & auVar60 | ~auVar60 & auVar39;
                    auVar61._8_4_ = -(uint)(auVar55._8_4_ < iVar3);
                    auVar61._0_8_ = CONCAT44(auVar61._8_4_,auVar61._8_4_);
                    auVar61._12_4_ = auVar61._8_4_;
                    uVar18 = ~auVar61._0_8_ & uVar18 | auVar55._0_8_ & auVar61._0_8_;
                    auVar55 = auVar53 & auVar61 | ~auVar61 & auVar55;
                    auVar40._8_4_ = -(uint)(auVar44._8_4_ < auVar55._8_4_);
                    auVar40._4_4_ = auVar40._8_4_;
                    auVar40._0_4_ = auVar40._8_4_;
                    auVar40._12_4_ = auVar40._8_4_;
                    *pauVar24 = ~auVar40 & auVar44 | auVar55 & auVar40;
                    pauVar24[1] = auVar44 & auVar40 | ~auVar40 & auVar55;
                    pauVar24 = pauVar24 + 2;
                    fVar63 = local_10b8;
                    fVar68 = fStack_10b4;
                    fVar71 = fStack_10b0;
                    fVar73 = fStack_10ac;
                  }
                  else {
                    lVar6 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                      }
                    }
                    iVar4 = *(int *)(local_10c8 + lVar6 * 4);
                    auVar65._8_4_ = iVar4;
                    auVar65._0_8_ = *(undefined8 *)(uVar17 + lVar6 * 8);
                    auVar65._12_4_ = 0;
                    auVar62._4_4_ = auVar60._8_4_;
                    auVar62._0_4_ = auVar60._8_4_;
                    auVar62._8_4_ = auVar60._8_4_;
                    auVar62._12_4_ = auVar60._8_4_;
                    auVar55 = auVar39 & auVar62 | ~auVar62 & auVar46;
                    auVar44 = auVar46 & auVar62 | ~auVar62 & auVar39;
                    auVar75._0_4_ = -(uint)(iVar3 < iVar4);
                    auVar75._4_4_ = -(uint)(iVar3 < iVar4);
                    auVar75._8_4_ = -(uint)(iVar3 < iVar4);
                    auVar75._12_4_ = -(uint)(iVar3 < iVar4);
                    auVar50 = auVar53 & auVar75 | ~auVar75 & auVar65;
                    auVar76 = ~auVar75 & auVar53 | auVar65 & auVar75;
                    auVar54._8_4_ = -(uint)(auVar44._8_4_ < auVar76._8_4_);
                    auVar54._4_4_ = auVar54._8_4_;
                    auVar54._0_4_ = auVar54._8_4_;
                    auVar54._12_4_ = auVar54._8_4_;
                    auVar66 = auVar44 & auVar54 | ~auVar54 & auVar76;
                    auVar47._8_4_ = -(uint)(auVar55._8_4_ < auVar50._8_4_);
                    auVar47._0_8_ = CONCAT44(auVar47._8_4_,auVar47._8_4_);
                    auVar47._12_4_ = auVar47._8_4_;
                    uVar18 = auVar55._0_8_ & auVar47._0_8_ | ~auVar47._0_8_ & auVar50._0_8_;
                    auVar55 = ~auVar47 & auVar55 | auVar50 & auVar47;
                    auVar41._8_4_ = -(uint)(auVar55._8_4_ < auVar66._8_4_);
                    auVar41._4_4_ = auVar41._8_4_;
                    auVar41._0_4_ = auVar41._8_4_;
                    auVar41._12_4_ = auVar41._8_4_;
                    *pauVar24 = ~auVar54 & auVar44 | auVar76 & auVar54;
                    pauVar24[1] = ~auVar41 & auVar55 | auVar66 & auVar41;
                    pauVar24[2] = auVar55 & auVar41 | ~auVar41 & auVar66;
                    pauVar24 = pauVar24 + 3;
                    fVar63 = local_10b8;
                    fVar68 = fStack_10b4;
                    fVar71 = fStack_10b0;
                    fVar73 = fStack_10ac;
                    fVar82 = local_1088;
                    fVar83 = fStack_1084;
                    fVar84 = fStack_1080;
                    fVar85 = fStack_107c;
                    fVar86 = local_1098;
                    fVar88 = fStack_1094;
                    fVar89 = fStack_1090;
                    fVar90 = fStack_108c;
                  }
                }
              }
            }
          }
          else {
            iVar16 = 6;
          }
        } while (iVar16 == 0);
        if (iVar16 == 6) {
          (**(code **)((long)local_1068->leafIntersector +
                      (ulong)*(byte *)(uVar18 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1060);
          fVar31 = (ray->super_RayK<1>).tfar;
          uVar22 = local_1070;
          fVar30 = fVar31;
          fVar32 = fVar31;
          fVar48 = fVar31;
          fVar80 = local_1008;
          fVar67 = fStack_1004;
          fVar69 = fStack_1000;
          fVar70 = fStack_ffc;
          fVar81 = local_1058;
          fVar77 = fStack_1054;
          fVar78 = fStack_1050;
          fVar79 = fStack_104c;
          fVar91 = local_1038;
          fVar92 = fStack_1034;
          fVar117 = fStack_1030;
          fVar118 = fStack_102c;
          fVar98 = local_1048;
          fVar100 = fStack_1044;
          fVar102 = fStack_1040;
          fVar106 = fStack_103c;
          fVar108 = local_ff8;
          fVar110 = fStack_ff4;
          fVar113 = fStack_ff0;
          fVar115 = fStack_fec;
          fVar63 = local_10b8;
          fVar68 = fStack_10b4;
          fVar71 = fStack_10b0;
          fVar73 = fStack_10ac;
          fVar82 = local_1088;
          fVar83 = fStack_1084;
          fVar84 = fStack_1080;
          fVar85 = fStack_107c;
          fVar86 = local_1098;
          fVar88 = fStack_1094;
          fVar89 = fStack_1090;
          fVar90 = fStack_108c;
          fVar93 = local_1018;
          fVar96 = fStack_1014;
          fVar97 = fStack_1010;
          fVar99 = fStack_100c;
          fVar101 = local_1028;
          fVar105 = fStack_1024;
          fVar107 = fStack_1020;
          fVar109 = fStack_101c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }